

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCheckedActualCall_actualCallWithNoReturnValueAndMeaninglessCallOrderForCoverage_Test::
testBody(TEST_MockCheckedActualCall_actualCallWithNoReturnValueAndMeaninglessCallOrderForCoverage_Test
         *this)

{
  int iVar1;
  MockActualCall *pMVar2;
  undefined4 extraout_var;
  UtestShell *test;
  MockUnexpectedCallHappenedFailure expectedFailure;
  MockCheckedActualCall actualCall;
  SimpleString local_130;
  TestFailure local_120;
  MockCheckedActualCall local_b8;
  MockNamedValue local_60;
  
  MockCheckedActualCall::MockCheckedActualCall
            (&local_b8,1,(this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).emptyList);
  SimpleString::SimpleString((SimpleString *)&local_120,"noreturn");
  pMVar2 = MockCheckedActualCall::withName(&local_b8,(SimpleString *)&local_120);
  iVar1 = (*pMVar2->_vptr_MockActualCall[3])(pMVar2,0);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xa8))
            (&local_60,(long *)CONCAT44(extraout_var,iVar1));
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString((SimpleString *)&local_120);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_130,"noreturn");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)&local_120,test,&local_130,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::~SimpleString(&local_130);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_120,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x69);
  TestFailure::~TestFailure(&local_120);
  MockCheckedActualCall::~MockCheckedActualCall(&local_b8);
  return;
}

Assistant:

TEST(MockCheckedActualCall, actualCallWithNoReturnValueAndMeaninglessCallOrderForCoverage)
{
    MockCheckedActualCall actualCall(1, reporter, *emptyList);
    actualCall.withName("noreturn").withCallOrder(0).returnValue();

    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "noreturn", *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}